

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall
DSectorPlaneInterpolation::DSectorPlaneInterpolation
          (DSectorPlaneInterpolation *this,sector_t *_sector,bool _plane,bool attach)

{
  bool attach_local;
  bool _plane_local;
  sector_t *_sector_local;
  DSectorPlaneInterpolation *this_local;
  
  DInterpolation::DInterpolation(&this->super_DInterpolation);
  (this->super_DInterpolation).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00b8bbd0;
  TArray<DInterpolation_*,_DInterpolation_*>::TArray(&this->attached);
  this->sector = _sector;
  this->ceiling = _plane;
  (*(this->super_DInterpolation).super_DObject._vptr_DObject[7])();
  if (attach) {
    P_Start3dMidtexInterpolations(&this->attached,this->sector,(bool)(this->ceiling & 1));
    P_StartLinkedSectorInterpolations(&this->attached,this->sector,(bool)(this->ceiling & 1));
  }
  FInterpolator::AddInterpolation(&interpolator,&this->super_DInterpolation);
  return;
}

Assistant:

DSectorPlaneInterpolation::DSectorPlaneInterpolation(sector_t *_sector, bool _plane, bool attach)
{
	sector = _sector;
	ceiling = _plane;
	UpdateInterpolation ();

	if (attach)
	{
		P_Start3dMidtexInterpolations(attached, sector, ceiling);
		P_StartLinkedSectorInterpolations(attached, sector, ceiling);
	}
	interpolator.AddInterpolation(this);
}